

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O1

Aig_Man_t * Saig_ManRetimeForwardOne(Aig_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  Vec_Ptr_t *vCut;
  void **ppvVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  
  Saig_ManMarkAutonomous(p);
  Aig_ManIncrementTravId(p);
  *pnRegFixed = 0;
  if (0 < p->nRegs) {
    pVVar2 = p->vCis;
    iVar4 = 0;
    do {
      uVar5 = p->nTruePis + iVar4;
      if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006e76c6;
      pvVar8 = pVVar2->pArray[uVar5];
      if (*(int *)((long)pvVar8 + 0x20) == p->nTravIds + -1) {
        *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
      }
      else {
        *pnRegFixed = *pnRegFixed + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->nRegs);
  }
  *pnRegMoves = 0;
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    ppvVar1 = pVVar2->pArray;
    lVar6 = 0;
    do {
      pvVar8 = ppvVar1[lVar6];
      if ((((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) &&
          (iVar4 = p->nTravIds,
          *(int *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x20) == iVar4)) &&
         (*(int *)((*(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe) + 0x20) == iVar4)) {
        *(int *)((long)pvVar8 + 0x20) = iVar4;
        *pnRegMoves = *pnRegMoves + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
  }
  lVar6 = (long)p->nRegs;
  if (0 < lVar6) {
    pVVar2 = p->vCis;
    uVar5 = p->nTruePis;
    uVar7 = (ulong)uVar5;
    do {
      if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar7)) {
LAB_006e76c6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(int *)((long)pVVar2->pArray[uVar7] + 0x20) = p->nTravIds;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  vCut = (Vec_Ptr_t *)malloc(0x10);
  vCut->nCap = 1000;
  vCut->nSize = 0;
  ppvVar1 = (void **)malloc(8000);
  vCut->pArray = ppvVar1;
  Aig_ManIncrementTravId(p);
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    do {
      pvVar8 = pVVar2->pArray[lVar6];
      if ((pvVar8 != (void *)0x0) &&
         (iVar4 = p->nTravIds + -1, *(int *)((long)pvVar8 + 0x20) != iVar4)) {
        pvVar9 = (void *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe);
        if ((pvVar9 != (void *)0x0) && (*(int *)((long)pvVar9 + 0x20) == iVar4)) {
          uVar5 = vCut->nCap;
          if (vCut->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (vCut->pArray == (void **)0x0) {
                ppvVar1 = (void **)malloc(0x80);
              }
              else {
                ppvVar1 = (void **)realloc(vCut->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_006e75a5;
              if (vCut->pArray == (void **)0x0) {
                ppvVar1 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar1 = (void **)realloc(vCut->pArray,(ulong)uVar5 << 4);
              }
            }
            vCut->pArray = ppvVar1;
            vCut->nCap = iVar4;
          }
LAB_006e75a5:
          iVar4 = vCut->nSize;
          vCut->nSize = iVar4 + 1;
          vCut->pArray[iVar4] = pvVar9;
          *(int *)((long)pvVar9 + 0x20) = p->nTravIds;
        }
        pvVar8 = (void *)(*(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe);
        if ((pvVar8 != (void *)0x0) && (*(int *)((long)pvVar8 + 0x20) == p->nTravIds + -1)) {
          uVar5 = vCut->nCap;
          if (vCut->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (vCut->pArray == (void **)0x0) {
                ppvVar1 = (void **)malloc(0x80);
              }
              else {
                ppvVar1 = (void **)realloc(vCut->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_006e763d;
              if (vCut->pArray == (void **)0x0) {
                ppvVar1 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar1 = (void **)realloc(vCut->pArray,(ulong)uVar5 << 4);
              }
            }
            vCut->pArray = ppvVar1;
            vCut->nCap = iVar4;
          }
LAB_006e763d:
          iVar4 = vCut->nSize;
          vCut->nSize = iVar4 + 1;
          vCut->pArray[iVar4] = pvVar8;
          *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar2 = p->vObjs;
    } while (lVar6 < pVVar2->nSize);
  }
  pAVar3 = Saig_ManRetimeDupForward(p,vCut);
  if (vCut->pArray != (void **)0x0) {
    free(vCut->pArray);
    vCut->pArray = (void **)0x0;
  }
  free(vCut);
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForwardOne( Aig_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Aig_Obj_t * pObj, * pFanin;
    int i;
    // mark the retimable nodes
    Saig_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Aig_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            Aig_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin0(pObj)) && Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
        pFanin = Aig_ObjFanin1(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
    }
    // finally derive the new manager
    pNew = Saig_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    return pNew;
}